

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::CollectInternal<(Memory::CollectionFlags)2449477633>(Recycler *this)

{
  BOOL BVar1;
  BOOL finishConcurrent;
  BOOL concurrent;
  Recycler *this_local;
  
  if ((this->inDispose & 1U) == 0) {
    CaptureCollectionParam(this,CollectOnScriptExit,false);
    BVar1 = CollectionInProgress(this);
    if (BVar1 == 0) {
      this_local._4_4_ = CollectWithHeuristic<(Memory::CollectionFlags)2449477633>(this);
    }
    else {
      this_local._4_4_ = TryFinishConcurrentCollect<(Memory::CollectionFlags)2449477633>(this);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL
Recycler::CollectInternal()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    // If we're in a re-entrant state, we want to allow GC to be triggered only
    // from allocation (or trigger points with AllowReentrant). This is to minimize
    // the number of reentrant GCs
    if ((flags & CollectOverride_AllowReentrant) == 0 && this->inDispose)
    {
        return false;
    }

#ifdef RECYCLER_TRACE
    CaptureCollectionParam(flags);
#endif

#if ENABLE_CONCURRENT_GC
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL finishConcurrent = flags & CollectOverride_FinishConcurrent;

    // If we priority boosted, we should try to finish it every chance we get
    // Otherwise, we should finishing it if we are not doing a concurrent GC,
    // or the flags tell us to always try to finish a concurrent GC (CollectOverride_FinishConcurrent)
    if ((!concurrent || finishConcurrent || priorityBoost) && this->CollectionInProgress())
    {
        return TryFinishConcurrentCollect<flags>();
    }
#endif

    if (flags & CollectHeuristic_Mask)
    {
        // Check some heuristics first before starting a collection
        return CollectWithHeuristic<flags>();
    }

    // Start a collection now.
    return Collect<flags>();
}